

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofConstraint::btGeneric6DofConstraint
          (btGeneric6DofConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *frameInA,
          btTransform *frameInB,bool useLinearReferenceFrameA)

{
  undefined8 uVar1;
  long lVar2;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,D6_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1158;
  uVar1 = *(undefined8 *)((frameInA->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInA->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInA->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInA->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = *(undefined8 *)(frameInA->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar1;
  btTranslationalLimitMotor::btTranslationalLimitMotor(&this->m_linearLimits);
  lVar2 = 0x37c;
  do {
    btRotationalLimitMotor::btRotationalLimitMotor
              ((btRotationalLimitMotor *)
               ((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar2 + -0x48));
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x43c);
  this->m_useLinearReferenceFrameA = useLinearReferenceFrameA;
  this->m_useOffsetForConstraintFrame = true;
  this->m_flags = 0;
  this->m_useSolveConstraintObsolete = false;
  calculateTransforms(this);
  return;
}

Assistant:

btGeneric6DofConstraint::btGeneric6DofConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, bool useLinearReferenceFrameA)
: btTypedConstraint(D6_CONSTRAINT_TYPE, rbA, rbB)
, m_frameInA(frameInA)
, m_frameInB(frameInB),
m_useLinearReferenceFrameA(useLinearReferenceFrameA),
m_useOffsetForConstraintFrame(D6_USE_FRAME_OFFSET),
m_flags(0),
m_useSolveConstraintObsolete(D6_USE_OBSOLETE_METHOD)
{
	calculateTransforms();
}